

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstractions.hpp
# Opt level: O2

bool __thiscall
Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::nextStep
          (Path *this,uint baseDepth)

{
  bool bVar1;
  size_t sVar2;
  
  bVar1 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
          top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_1_>
                    ();
  if (bVar1) {
    push(this,0);
    bVar1 = true;
  }
  else {
    Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
    top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_1_>
              (this);
    while( true ) {
      sVar2 = depth(this);
      if (sVar2 < 2) break;
      sVar2 = depth(this);
      if (sVar2 < baseDepth) break;
      bVar1 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
              top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_2_>
                        (this);
      if (bVar1) break;
      pop(this);
      Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
      top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_2_>
                (this);
    }
    sVar2 = depth(this);
    if (sVar2 < baseDepth) {
      bVar1 = false;
    }
    else {
      sVar2 = depth(this);
      bVar1 = sVar2 != 1;
    }
  }
  return bVar1;
}

Assistant:

bool nextStep(unsigned baseDepth) {
      if (top([](auto t){ return t.canPush(); })) {
        push(0);
        return true;
      } else {
        top([](auto& x) { x.idx++; });
        while(depth() > 1 && depth() >= baseDepth && !top([&](auto t) { return t.inBounds(); })) {
          pop();
          top([](auto& x) { x.idx++; });
        }
        if (depth() < baseDepth || depth() == 1) {
          return false;
        } else {
          return true;
        }
      }
    }